

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O3

ssize_t __thiscall Amiga::Chipset::read(Chipset *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  uint uVar4;
  undefined8 unaff_RBX;
  undefined6 uVar6;
  ulong uVar5;
  
  uVar6 = (undefined6)((ulong)unaff_RBX >> 0x10);
  switch(__fd & 0x1fe) {
  case 2:
    uVar1 = this->dma_control_;
    uVar2 = Blitter<false>::get_status(&this->blitter_);
    uVar5 = CONCAT62(extraout_var,uVar2) & 0xffffffff;
    uVar5 = CONCAT62((int6)(uVar5 >> 0x10),(ushort)uVar5 | uVar1);
    break;
  case 4:
    uVar3 = (uint)this->y_ >> 8;
    uVar4 = (uint)this->is_long_field_ << 0xf;
    goto LAB_00210de4;
  case 6:
    uVar3 = (uint)this->line_cycle_ >> 1 & 0xff;
    uVar4 = this->y_ << 8;
LAB_00210de4:
    uVar5 = (ulong)(uVar4 | uVar3);
    break;
  default:
    uVar5 = CONCAT62(uVar6,0xffff);
    if ((char)__buf != '\0') {
      write(this,__fd,(void *)0xffff,0);
    }
    break;
  case 10:
    uVar2 = Mouse::get_position(&this->mouse_);
    return CONCAT62(extraout_var_00,uVar2);
  case 0xc:
    uVar2 = Amiga::Joystick::get_position
                      ((Joystick *)
                       (((this->joysticks_).
                         super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                       ._M_t);
    return CONCAT62(extraout_var_01,uVar2);
  case 0xe:
    uVar5 = (ulong)this->collisions_;
    this->collisions_ = 0;
    break;
  case 0x10:
    uVar5 = (ulong)this->paula_disk_control_;
    break;
  case 0x16:
    uVar5 = CONCAT62(uVar6,0xff00);
    break;
  case 0x18:
    uVar5 = CONCAT62(uVar6,0x3000);
    break;
  case 0x1a:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Chipset.cpp"
                  ,0x483,"uint16_t Amiga::Chipset::read(uint32_t, bool)");
  case 0x1c:
    uVar5 = (ulong)this->interrupt_enable_;
    break;
  case 0x1e:
    uVar5 = (ulong)this->interrupt_requests_;
  }
  return uVar5 & 0xffffffff;
}

Assistant:

uint16_t Chipset::read(uint32_t address, bool allow_conversion) {
	switch(address & ChipsetAddressMask) {
		default:
			// If there was nothing to read, perform a write.
			// TODO: Rather than 0xffff, should be whatever is left on the bus, vapour-lock style.
			if(allow_conversion) write(address, 0xffff, false);
		return 0xffff;

		// Raster position.
		case 0x004: {		// VPOSR; b15 = LOF, b0 = b8 of y position.
			const uint16_t position = uint16_t(y_ >> 8);
			return
				position |
				(is_long_field_ ? 0x8000 : 0x0000);

			// b8–b14 should be:
			//	00 for PAL Agnus or fat Agnus
			//	10 for NTSC Agnus or fat Agnus
			//	20 for PAL high-res
			//	30 for NTSC high-res
		}
		case 0x006: {		// VHPOSR; b0–b7 = horizontal; b8–b15 = low bits of vertical position.
			const uint16_t position = uint16_t(((line_cycle_ >> 1) & 0x00ff) | (y_ << 8));
			return position;
		}

		case 0x00e: {		// CLXDAT
			const uint16_t result = collisions_;
			collisions_ = 0;
			return result;
		};

		// Joystick/mouse input.
		case 0x00a:	return mouse_.get_position();			// JOY0DAT
		case 0x00c:	return joystick(0).get_position();		// JOY1DAT

		case 0x016:		// POTGOR / POTINP
//			logger.error().append("TODO: pot port read");
		return 0xff00;

		// Disk DMA and control.
		case 0x010:		// ADKCONR
			logger.info().append("Read disk control");
		return paula_disk_control_;
		case 0x01a:		// DSKBYTR
			logger.error().append("TODO: disk status");
			assert(false);	// Not yet implemented.
		return 0xffff;

		// Serial port.
		case 0x018:	return serial_.get_status();

		// DMA management.
		case 0x002:	return dma_control_ | blitter_.get_status();		// DMACONR

		// Interrupts.
		case 0x01c:	return interrupt_enable_;							// INTENAR
		case 0x01e:	return interrupt_requests_;							// INTREQR
	}
}